

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

AliasRet aa_ahref(jit_State *J,IRIns *refa,IRIns *refb)

{
  IROp1 *pIVar1;
  IRIns *J_00;
  AliasRet AVar2;
  IRRef2 IVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  IRRef2 IVar9;
  
  AVar2 = ALIAS_MUST;
  if (refa == refb) {
    return ALIAS_MUST;
  }
  uVar4 = (refb->field_0).op2;
  uVar6 = (refa->field_0).op2;
  J_00 = (J->cur).ir;
  pIVar8 = J_00 + uVar6;
  if ((pIVar8->field_1).o == '\x1e') {
    uVar6 = (pIVar8->field_0).op1;
    pIVar8 = J_00 + uVar6;
  }
  pIVar7 = J_00 + uVar4;
  if ((pIVar7->field_1).o == '\x1e') {
    uVar4 = (pIVar7->field_0).op1;
    pIVar7 = J_00 + uVar4;
  }
  pIVar1 = &(refa->field_1).o;
  if ((*pIVar1 & 0xfe) == 0x38) {
    refa = J_00 + (refa->field_0).op1;
  }
  if (((refb->field_1).o & 0xfe) == 0x38) {
    refb = J_00 + (refb->field_0).op1;
  }
  if (uVar6 != uVar4) {
    if ((-1 < (short)uVar6) && (-1 < (short)uVar4)) {
      return ALIAS_NO;
    }
    if (*pIVar1 == 0x38) {
      IVar9 = 0;
      uVar5 = uVar6;
      if (((pIVar8->field_1).o == ')') && (-1 < (long)(short)(pIVar8->field_0).op2)) {
        uVar5 = (pIVar8->field_0).op1;
        IVar9 = J_00[(short)(pIVar8->field_0).op2].field_1.op12;
        if ((uVar5 == uVar4) && (IVar9 != 0)) {
          return ALIAS_NO;
        }
      }
      IVar3 = 0;
      if (((pIVar7->field_1).o == ')') && (IVar3 = 0, -1 < (long)(short)(pIVar7->field_0).op2)) {
        uVar4 = (pIVar7->field_0).op1;
        IVar3 = J_00[(short)(pIVar7->field_0).op2].field_1.op12;
        if ((uVar6 == uVar4) && (IVar3 != 0)) {
          return ALIAS_NO;
        }
      }
      if ((uVar5 == uVar4) && (IVar9 != IVar3)) {
        return ALIAS_NO;
      }
    }
    else if ((((pIVar7->field_1).t.irt ^ (pIVar8->field_1).t.irt) & 0x1f) != 0) {
      return ALIAS_NO;
    }
    AVar2 = ALIAS_MAY;
  }
  if ((refa->field_0).op1 != (refb->field_0).op1) {
    AVar2 = aa_table((jit_State *)&J_00->field_0,(uint)(refa->field_0).op1,(uint)(refb->field_0).op1
                    );
    return AVar2;
  }
  return AVar2;
}

Assistant:

static AliasRet aa_ahref(jit_State *J, IRIns *refa, IRIns *refb)
{
  IRRef ka = refa->op2;
  IRRef kb = refb->op2;
  IRIns *keya, *keyb;
  IRRef ta, tb;
  if (refa == refb)
    return ALIAS_MUST;  /* Shortcut for same refs. */
  keya = IR(ka);
  if (keya->o == IR_KSLOT) { ka = keya->op1; keya = IR(ka); }
  keyb = IR(kb);
  if (keyb->o == IR_KSLOT) { kb = keyb->op1; keyb = IR(kb); }
  ta = (refa->o==IR_HREFK || refa->o==IR_AREF) ? IR(refa->op1)->op1 : refa->op1;
  tb = (refb->o==IR_HREFK || refb->o==IR_AREF) ? IR(refb->op1)->op1 : refb->op1;
  if (ka == kb) {
    /* Same key. Check for same table with different ref (NEWREF vs. HREF). */
    if (ta == tb)
      return ALIAS_MUST;  /* Same key, same table. */
    else
      return aa_table(J, ta, tb);  /* Same key, possibly different table. */
  }
  if (irref_isk(ka) && irref_isk(kb))
    return ALIAS_NO;  /* Different constant keys. */
  if (refa->o == IR_AREF) {
    /* Disambiguate array references based on index arithmetic. */
    int32_t ofsa = 0, ofsb = 0;
    IRRef basea = ka, baseb = kb;
    lj_assertJ(refb->o == IR_AREF, "expected AREF");
    /* Gather base and offset from t[base] or t[base+-ofs]. */
    if (keya->o == IR_ADD && irref_isk(keya->op2)) {
      basea = keya->op1;
      ofsa = IR(keya->op2)->i;
      if (basea == kb && ofsa != 0)
	return ALIAS_NO;  /* t[base+-ofs] vs. t[base]. */
    }
    if (keyb->o == IR_ADD && irref_isk(keyb->op2)) {
      baseb = keyb->op1;
      ofsb = IR(keyb->op2)->i;
      if (ka == baseb && ofsb != 0)
	return ALIAS_NO;  /* t[base] vs. t[base+-ofs]. */
    }
    if (basea == baseb && ofsa != ofsb)
      return ALIAS_NO;  /* t[base+-o1] vs. t[base+-o2] and o1 != o2. */
  } else {
    /* Disambiguate hash references based on the type of their keys. */
    lj_assertJ((refa->o==IR_HREF || refa->o==IR_HREFK || refa->o==IR_NEWREF) &&
	       (refb->o==IR_HREF || refb->o==IR_HREFK || refb->o==IR_NEWREF),
	       "bad xREF IR op %d or %d", refa->o, refb->o);
    if (!irt_sametype(keya->t, keyb->t))
      return ALIAS_NO;  /* Different key types. */
  }
  if (ta == tb)
    return ALIAS_MAY;  /* Same table, cannot disambiguate keys. */
  else
    return aa_table(J, ta, tb);  /* Try to disambiguate tables. */
}